

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<3>::IsIdentity(SquareMatrix<3> *this)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = 0;
  bVar5 = false;
  do {
    uVar3 = 0;
    bVar4 = false;
    do {
      fVar1 = (*(Float (*) [3])*(Float (*) [3])this)[uVar3];
      if (uVar2 == uVar3) {
        bVar6 = fVar1 == 1.0;
      }
      else {
        bVar6 = fVar1 == 0.0;
      }
      if ((!bVar6) || (NAN(fVar1))) {
        if (!bVar4) {
          return bVar5;
        }
        break;
      }
      bVar4 = 1 < uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 3);
    bVar5 = 1 < uVar2;
    uVar2 = uVar2 + 1;
    this = (SquareMatrix<3> *)((long)this + 0xc);
    if (uVar2 == 3) {
      return bVar5;
    }
  } while( true );
}

Assistant:

inline bool SquareMatrix<N>::IsIdentity() const {
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j) {
            if (i == j) {
                if (m[i][j] != 1)
                    return false;
            } else if (m[i][j] != 0)
                return false;
        }
    return true;
}